

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynom.cpp
# Opt level: O1

Polynom<Rational> __thiscall
Polynom<Rational>::ordinalSub(Polynom<Rational> *this,Polynom<Rational> *a)

{
  uint uVar1;
  pointer puVar2;
  bool bVar3;
  char cVar4;
  compare_t cVar5;
  matrix_error *this_00;
  int iVar6;
  ulong uVar7;
  int iVar8;
  Polynom<Rational> *in_RDX;
  pointer *ppuVar9;
  Rational *extraout_RDX;
  Rational *extraout_RDX_00;
  Rational *pRVar10;
  BigInteger *pBVar11;
  Polynom<Rational> PVar12;
  Polynom<Rational> res;
  Matrix<Rational> m;
  BigInteger mid;
  BigInteger r;
  BigInteger l;
  BigInteger local_138;
  BigInteger local_118;
  Matrix<Rational> local_f8;
  BigInteger local_e8;
  Polynom<Rational> *local_c8;
  BigInteger local_c0;
  BigInteger local_a0;
  ulong local_80;
  ulong local_78;
  BigInteger local_70;
  BigInteger local_50;
  
  bVar3 = isOrdinal(a);
  if ((!bVar3) || (bVar3 = isOrdinal(in_RDX), !bVar3)) {
    this_00 = (matrix_error *)__cxa_allocate_exception(0x10);
    matrix_error::runtime_error(this_00,"Invalid ordinal");
    __cxa_throw(this_00,&matrix_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar1 = (a->m).N;
  iVar6 = -1;
  if ((ulong)uVar1 != 0) {
    ppuVar9 = &(((a->m).arr)->_numerator).digits.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    uVar7 = 0;
    do {
      if (((_Vector_impl_data *)(ppuVar9 + -1))->_M_start != *ppuVar9) {
        iVar6 = ~(uint)uVar7 + uVar1;
        break;
      }
      uVar7 = uVar7 + 1;
      ppuVar9 = ppuVar9 + 8;
    } while (uVar1 != uVar7);
  }
  if (-1 < iVar6) {
    uVar1 = (in_RDX->m).N;
    iVar8 = -1;
    if ((ulong)uVar1 != 0) {
      ppuVar9 = &(((in_RDX->m).arr)->_numerator).digits.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      uVar7 = 0;
      do {
        if (((_Vector_impl_data *)(ppuVar9 + -1))->_M_start != *ppuVar9) {
          iVar8 = ~(uint)uVar7 + uVar1;
          break;
        }
        uVar7 = uVar7 + 1;
        ppuVar9 = ppuVar9 + 8;
      } while (uVar1 != uVar7);
    }
    if (iVar8 <= iVar6) {
      local_c8 = a;
      Matrix<Rational>::Matrix(&local_f8,1,iVar6 + 1U);
      uVar7 = 0;
      local_80 = (ulong)(iVar6 + 1U);
      do {
        BigInteger::BigInteger(&local_a0,0);
        BigInteger::BigInteger(&local_c0,1);
        local_78 = uVar7;
        while( true ) {
          BigInteger::BigInteger(&local_70,1);
          ::operator-(&local_e8,&local_c0,&local_70);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    (&local_138.digits,&local_e8.digits);
          local_138.negative = local_e8.negative;
          BigInteger::BigInteger(&local_118,1);
          pRVar10 = local_f8.arr;
          puVar2 = local_f8.arr[uVar7]._numerator.digits.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_f8.arr[uVar7]._numerator.digits.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start =
               local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
          ppuVar9 = &local_f8.arr[uVar7]._numerator.digits.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppuVar9 = local_138.digits.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          ppuVar9[1] = local_138.digits.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
          local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if (puVar2 != (pointer)0x0) {
            operator_delete(puVar2);
          }
          pRVar10[uVar7]._numerator.negative = local_138.negative;
          puVar2 = pRVar10[uVar7]._denominator.digits.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pRVar10[uVar7]._denominator.digits.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start =
               local_118.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
          pRVar10[uVar7]._denominator.digits.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_118.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          pRVar10[uVar7]._denominator.digits.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               local_118.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
          local_118.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_118.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_118.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if (puVar2 != (pointer)0x0) {
            operator_delete(puVar2);
          }
          pRVar10[uVar7]._denominator.negative = local_118.negative;
          if (local_118.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_118.digits.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_138.digits.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_e8.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_e8.digits.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_70.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_70.digits.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          Polynom(this,&local_f8);
          ordinalAdd((Polynom<Rational> *)&local_138,in_RDX);
          cVar5 = ordinalCmp(local_c8,(Polynom<Rational> *)&local_138);
          Matrix<Rational>::~Matrix((Matrix<Rational> *)&local_138);
          cVar4 = '\x01';
          if (cVar5 != CMP_EQUAL) {
            Matrix<Rational>::~Matrix(&this->m);
            cVar4 = (cVar5 == CMP_LESS) * '\x05';
          }
          if (cVar4 != '\0') break;
          BigInteger::BigInteger(&local_50,2);
          BigInteger::operator*=(&local_c0,&local_50);
          if (local_50.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_50.digits.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
        }
        if (cVar4 == '\x05') {
          do {
            BigInteger::BigInteger(&local_e8,1);
            ::operator+(&local_138,&local_a0,&local_e8);
            cVar5 = BigInteger::_compare(&local_138,&local_c0);
            if (local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_138.digits.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_e8.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_e8.digits.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if (cVar5 != CMP_LESS) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                        (&local_138.digits,&local_a0.digits);
              local_138.negative = local_a0.negative;
              BigInteger::BigInteger(&local_118,1);
              pRVar10 = local_f8.arr;
              puVar2 = local_f8.arr[uVar7]._numerator.digits.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              local_f8.arr[uVar7]._numerator.digits.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start =
                   local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
              ppuVar9 = &local_f8.arr[uVar7]._numerator.digits.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              *ppuVar9 = local_138.digits.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              ppuVar9[1] = local_138.digits.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
              local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              if (puVar2 != (pointer)0x0) {
                operator_delete(puVar2);
              }
              pRVar10[uVar7]._numerator.negative = local_138.negative;
              puVar2 = pRVar10[uVar7]._denominator.digits.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              pRVar10[uVar7]._denominator.digits.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start =
                   local_118.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
              pRVar10[uVar7]._denominator.digits.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_118.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
              pRVar10[uVar7]._denominator.digits.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   local_118.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
              local_118.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_118.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_118.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              if (puVar2 != (pointer)0x0) {
                operator_delete(puVar2);
              }
              pRVar10[uVar7]._denominator.negative = local_118.negative;
              if (local_118.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_118.digits.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              if (local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_138.digits.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              bVar3 = true;
              goto LAB_0013f714;
            }
            ::operator+(&local_138,&local_a0,&local_c0);
            BigInteger::BigInteger(&local_70,2);
            ::operator/(&local_e8,&local_138,&local_70);
            if (local_70.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_70.digits.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_138.digits.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      (&local_138.digits,&local_e8.digits);
            local_138.negative = local_e8.negative;
            BigInteger::BigInteger(&local_118,1);
            pRVar10 = local_f8.arr;
            puVar2 = local_f8.arr[uVar7]._numerator.digits.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            local_f8.arr[uVar7]._numerator.digits.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
            ppuVar9 = &local_f8.arr[uVar7]._numerator.digits.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppuVar9 = local_138.digits.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            ppuVar9[1] = local_138.digits.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
            local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_start = (pointer)0x0;
            local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_finish = (pointer)0x0;
            local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            if (puVar2 != (pointer)0x0) {
              operator_delete(puVar2);
            }
            pRVar10[uVar7]._numerator.negative = local_138.negative;
            puVar2 = pRVar10[uVar7]._denominator.digits.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pRVar10[uVar7]._denominator.digits.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_118.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
            pRVar10[uVar7]._denominator.digits.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_118.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            pRVar10[uVar7]._denominator.digits.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_118.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
            local_118.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_start = (pointer)0x0;
            local_118.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_finish = (pointer)0x0;
            local_118.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            if (puVar2 != (pointer)0x0) {
              operator_delete(puVar2);
            }
            pRVar10[uVar7]._denominator.negative = local_118.negative;
            if (local_118.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_118.digits.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_138.digits.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            Polynom(this,&local_f8);
            ordinalAdd((Polynom<Rational> *)&local_138,in_RDX);
            cVar5 = ordinalCmp(local_c8,(Polynom<Rational> *)&local_138);
            pBVar11 = &local_138;
            if (cVar5 != CMP_EQUAL) {
              if (cVar5 == CMP_LESS) {
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                          (&local_c0.digits,&local_e8.digits);
                pBVar11 = &local_c0;
              }
              else {
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                          (&local_a0.digits,&local_e8.digits);
                pBVar11 = &local_a0;
              }
              pBVar11->negative = local_e8.negative;
              Matrix<Rational>::~Matrix((Matrix<Rational> *)&local_138);
              pBVar11 = (BigInteger *)this;
            }
            Matrix<Rational>::~Matrix((Matrix<Rational> *)pBVar11);
            if (local_e8.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_e8.digits.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
          } while (cVar5 != CMP_EQUAL);
        }
        bVar3 = false;
LAB_0013f714:
        if (local_c0.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_c0.digits.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_a0.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_a0.digits.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (!bVar3) goto LAB_0013f763;
        uVar7 = local_78 + 1;
      } while (uVar7 != local_80);
      Polynom(this,&local_f8);
LAB_0013f763:
      Matrix<Rational>::~Matrix(&local_f8);
      pRVar10 = extraout_RDX_00;
      goto LAB_0013f76d;
    }
  }
  Polynom(this);
  pRVar10 = extraout_RDX;
LAB_0013f76d:
  PVar12.m.arr = pRVar10;
  PVar12.m._0_8_ = this;
  return (Polynom<Rational>)PVar12.m;
}

Assistant:

const Polynom<Field> Polynom<Field>::ordinalSub(const Polynom &a) const
{
    if(!isOrdinal() || !a.isOrdinal())
        throw matrix_error("Invalid ordinal");
    int d = degree();
    if(d < 0 || d < a.degree())
        return Polynom();
    Matrix<Field> m(1, d + 1);
    for(int coeff = 0; coeff < d + 1; ++coeff)
    {
        BigInteger l = 0, r = 1;
        for(;; r *= 2)
        {
            m[0][coeff] = r - 1;
            Polynom t(m);
            Polynom res = a.ordinalAdd(t);
            compare_t cmp = ordinalCmp(res);
            if(cmp == CMP_EQUAL)
                return t;
            if(cmp == CMP_LESS)
                break;
        }
        while(l + 1 < r)
        {
            BigInteger mid = (l + r) / 2;
            m[0][coeff] = mid;
            Polynom t(m);
            Polynom res = a.ordinalAdd(t);
            compare_t cmp = ordinalCmp(res);
            if(cmp == CMP_EQUAL)
                return t;
            if(cmp == CMP_LESS)
                r = mid;
            else
                l = mid;
        }
        m[0][coeff] = l;
    }
    return Polynom(m);
}